

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O1

void xml_print_leaf(lyout *out,int level,lyd_node *node,int toplevel,int options)

{
  int iVar1;
  lys_module *plVar2;
  lys_ident *plVar3;
  lys_type *plVar4;
  lys_node *plVar5;
  char *pcVar6;
  LY_DATA_TYPE LVar7;
  ulong uVar8;
  char *pcVar9;
  lyout *out_00;
  char **local_58;
  char **prefs;
  char **nss;
  lyout *plStack_40;
  uint32_t ns_count;
  lys_ident *local_38;
  
  if (((toplevel == 0) && (node->parent != (lyd_node *)0x0)) &&
     (iVar1 = nscmp(node,node->parent), iVar1 == 0)) {
    uVar8 = (ulong)(level * 2 - 2);
    if (level == 0) {
      uVar8 = (ulong)(uint)level;
    }
    ly_print(out,"%*s<%s",uVar8,"",node->schema->name);
  }
  else {
    plVar2 = lyd_node_module(node);
    uVar8 = (ulong)(level * 2 - 2);
    if (level == 0) {
      uVar8 = (ulong)(uint)level;
    }
    ly_print(out,"%*s<%s xmlns=\"%s\"",uVar8,"",node->schema->name,plVar2->ns);
  }
  if (toplevel != 0) {
    xml_print_ns(out,node,options);
  }
  plStack_40 = out;
  xml_print_attrs(out,node,options);
  LVar7 = (uint)*(ushort *)&node[1].validity & 0x3f;
  local_38 = (lys_ident *)node;
LAB_0018165b:
  do {
    plVar3 = local_38;
    out_00 = plStack_40;
    switch(LVar7) {
    case LY_TYPE_BINARY:
    case LY_TYPE_BITS:
    case LY_TYPE_BOOL:
    case LY_TYPE_DEC64:
    case LY_TYPE_ENUM:
    case LY_TYPE_STRING:
    case LY_TYPE_INT8:
    case LY_TYPE_UINT8:
    case LY_TYPE_INT16:
    case LY_TYPE_UINT16:
    case LY_TYPE_INT32:
    case LY_TYPE_UINT32:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT64:
      if ((local_38->module != (lys_module *)0x0) && (*(char *)&local_38->module->ctx != '\0')) {
        ly_print(plStack_40,">");
        lyxml_dump_text(out_00,(char *)plVar3->module);
        plVar5 = (lys_node *)plVar3->name;
        goto LAB_0018174c;
      }
    case LY_TYPE_EMPTY:
switchD_0018166d_caseD_5:
      pcVar9 = "/>";
LAB_00181769:
      ly_print(plStack_40,pcVar9);
      goto LAB_00181777;
    case LY_TYPE_IDENT:
      plVar2 = local_38->module;
      if ((plVar2 == (lys_module *)0x0) || (*(char *)&plVar2->ctx == '\0'))
      goto switchD_0018166d_caseD_5;
      pcVar9 = strchr((char *)plVar2,0x3a);
      if (pcVar9 == (char *)0x0) {
        __assert_fail("p",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_xml.c"
                      ,0x13d,
                      "void xml_print_leaf(struct lyout *, int, const struct lyd_node *, int, int)")
        ;
      }
      pcVar6 = ((lys_node *)local_38->name)->module->name;
      iVar1 = strncmp((char *)plVar2,pcVar6,(long)pcVar9 - (long)plVar2);
      out_00 = plStack_40;
      LVar7 = LY_TYPE_INST;
      if ((iVar1 == 0) && (pcVar6[(long)pcVar9 - (long)plVar2] == '\0')) {
        ly_print(plStack_40,">");
        lyxml_dump_text(out_00,pcVar9 + 1);
        plVar5 = (lys_node *)local_38->name;
LAB_0018174c:
        ly_print(out_00,"</%s>",plVar5->name);
LAB_00181777:
        if (level != 0) {
          pcVar9 = "\n";
LAB_00181784:
          ly_print(out_00,pcVar9);
        }
        return;
      }
      break;
    case LY_TYPE_INST:
      pcVar6 = transform_json2xml(*(lys_module **)(local_38->name + 0x30),(char *)local_38->module,
                                  &local_58,&prefs,(uint32_t *)((long)&nss + 4));
      out_00 = plStack_40;
      pcVar9 = "\"(!error!)\"";
      if (pcVar6 != (char *)0x0) {
        if (nss._4_4_ != 0) {
          uVar8 = 0;
          do {
            ly_print(out_00," xmlns:%s=\"%s\"",local_58[uVar8],prefs[uVar8]);
            uVar8 = uVar8 + 1;
          } while (uVar8 < nss._4_4_);
        }
        free(local_58);
        free(prefs);
        if (*pcVar6 == '\0') {
          ly_print(out_00,"/>");
          plVar3 = local_38;
        }
        else {
          ly_print(out_00,">");
          lyxml_dump_text(out_00,pcVar6);
          plVar3 = local_38;
          ly_print(out_00,"</%s>",((lys_node *)local_38->name)->name);
        }
        lydict_remove(((lys_node *)plVar3->name)->module->ctx,pcVar6);
        goto LAB_00181777;
      }
      goto LAB_00181784;
    case LY_TYPE_LEAFREF:
      do {
        plVar3 = ((lyd_val *)&plVar3->base)->ident;
        if (plVar3 == (lys_ident *)0x0) {
          plVar4 = lyd_leaf_type((lyd_node_leaf_list *)local_38);
          if (plVar4 != (lys_type *)0x0) {
            LVar7 = plVar4->base;
            goto LAB_0018165b;
          }
          pcVar9 = "\"(!error!)\"";
          out_00 = plStack_40;
          goto LAB_00181784;
        }
      } while ((uint)*(ushort *)&plVar3->der == LY_TYPE_LEAFREF);
      LVar7 = (uint)*(ushort *)&plVar3->der & 0x3f;
      break;
    default:
      pcVar9 = "\"(!error!)\"";
      goto LAB_00181769;
    }
  } while( true );
}

Assistant:

static void
xml_print_leaf(struct lyout *out, int level, const struct lyd_node *node, int toplevel, int options)
{
    const struct lyd_node_leaf_list *leaf = (struct lyd_node_leaf_list *)node, *iter;
    const struct lys_type *type;
    const char *ns, *mod_name;
    const char **prefs, **nss;
    const char *xml_expr;
    uint32_t ns_count, i;
    LY_DATA_TYPE datatype;
    char *p;
    size_t len;

    if (toplevel || !node->parent || nscmp(node, node->parent)) {
        /* print "namespace" */
        ns = lyd_node_module(node)->ns;
        ly_print(out, "%*s<%s xmlns=\"%s\"", LEVEL, INDENT, node->schema->name, ns);
    } else {
        ly_print(out, "%*s<%s", LEVEL, INDENT, node->schema->name);
    }

    if (toplevel) {
        xml_print_ns(out, node, options);
    }

    xml_print_attrs(out, node, options);
    datatype = leaf->value_type & LY_DATA_TYPE_MASK;
printvalue:
    switch (datatype) {
    case LY_TYPE_BINARY:
    case LY_TYPE_STRING:
    case LY_TYPE_BITS:
    case LY_TYPE_ENUM:
    case LY_TYPE_BOOL:
    case LY_TYPE_DEC64:
    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_UINT64:
        if (!leaf->value_str || !leaf->value_str[0]) {
            ly_print(out, "/>");
        } else {
            ly_print(out, ">");
            lyxml_dump_text(out, leaf->value_str);
            ly_print(out, "</%s>", node->schema->name);
        }
        break;

    case LY_TYPE_IDENT:
        if (!leaf->value_str || !leaf->value_str[0]) {
            ly_print(out, "/>");
            break;
        }
        p = strchr(leaf->value_str, ':');
        assert(p);
        len = p - leaf->value_str;
        mod_name = leaf->schema->module->name;
        if (!strncmp(leaf->value_str, mod_name, len) && !mod_name[len]) {
            ly_print(out, ">");
            lyxml_dump_text(out, ++p);
            ly_print(out, "</%s>", node->schema->name);
        } else {
            /* avoid code duplication - use instance-identifier printer which gets necessary namespaces to print */
            datatype = LY_TYPE_INST;
            goto printvalue;
        }
        break;
    case LY_TYPE_INST:
        xml_expr = transform_json2xml(node->schema->module, ((struct lyd_node_leaf_list *)node)->value_str,
                                      &prefs, &nss, &ns_count);
        if (!xml_expr) {
            /* error */
            ly_print(out, "\"(!error!)\"");
            return;
        }

        for (i = 0; i < ns_count; ++i) {
            ly_print(out, " xmlns:%s=\"%s\"", prefs[i], nss[i]);
        }
        free(prefs);
        free(nss);

        if (xml_expr[0]) {
            ly_print(out, ">");
            lyxml_dump_text(out, xml_expr);
            ly_print(out, "</%s>", node->schema->name);
        } else {
            ly_print(out, "/>");
        }
        lydict_remove(node->schema->module->ctx, xml_expr);
        break;

    case LY_TYPE_LEAFREF:
        iter = (struct lyd_node_leaf_list *)leaf->value.leafref;
        while (iter && (iter->value_type == LY_TYPE_LEAFREF)) {
            iter = (struct lyd_node_leaf_list *)iter->value.leafref;
        }
        if (!iter) {
            /* unresolved and invalid, but we can learn the correct type anyway */
            type = lyd_leaf_type((struct lyd_node_leaf_list *)leaf);
            if (!type) {
                /* error */
                ly_print(out, "\"(!error!)\"");
                return;
            }
            datatype = type->base;
        } else {
            datatype = iter->value_type & LY_DATA_TYPE_MASK;
        }
        goto printvalue;

    case LY_TYPE_EMPTY:
        ly_print(out, "/>");
        break;

    default:
        /* error */
        ly_print(out, "\"(!error!)\"");
    }

    if (level) {
        ly_print(out, "\n");
    }
}